

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  cmMakefile *this_00;
  Snapshot snapshot;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  cmGlobalGenerator *this_01;
  cmLocalGenerator *lg;
  char *pcVar4;
  cmTarget *this_02;
  cmGeneratorTarget *target;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  pointer lib;
  string includes;
  string includeFlags;
  string systemFile;
  string definitions;
  string linkPath;
  string packageName;
  string mode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string linkFlags;
  string language;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Snapshot local_48;
  
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&systemFile,(SystemTools *)0x1,collapse)
  ;
  SetHomeOutputDirectory(this,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  this_01 = (cmGlobalGenerator *)operator_new(0x5c8);
  cmGlobalGenerator::cmGlobalGenerator(this_01,this);
  SetGlobalGenerator(this,this_01);
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
  snapshot.Position.Tree._0_4_ = (int)local_48.Position.Tree;
  snapshot.State = local_48.State;
  snapshot.Position.Tree._4_4_ = (int)((ulong)local_48.Position.Tree >> 0x20);
  snapshot.Position.Position = local_48.Position.Position;
  lg = cmGlobalGenerator::MakeLocalGenerator(this_01,snapshot,(cmLocalGenerator *)0x0);
  this_00 = lg->Makefile;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&systemFile,(SystemTools *)0x1,collapse_00);
  cmMakefile::SetCurrentBinaryDirectory(this_00,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&systemFile,(SystemTools *)0x1,collapse_01);
  cmMakefile::SetCurrentSourceDirectory(this_00,&systemFile);
  std::__cxx11::string::~string((string *)&systemFile);
  cmMakefile::SetArgcArgv(this_00,args);
  cmMakefile::GetModulesFile_abi_cxx11_(&systemFile,this_00,"CMakeFindPackageMode.cmake");
  cmMakefile::ReadListFile(this_00,systemFile._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&mode,"LANGUAGE",(allocator *)&packageName);
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,&mode);
  std::__cxx11::string::string((string *)&language,pcVar4,(allocator *)&includes);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::string((string *)&packageName,"MODE",(allocator *)&includes);
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,&packageName);
  std::__cxx11::string::string((string *)&mode,pcVar4,(allocator *)&includeFlags);
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::string((string *)&includes,"NAME",(allocator *)&includeFlags);
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,&includes);
  std::__cxx11::string::string((string *)&packageName,pcVar4,(allocator *)&definitions);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string((string *)&includes,"PACKAGE_FOUND",(allocator *)&includeFlags);
  bVar1 = cmMakefile::IsOn(this_00,&includes);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string((string *)&includes,"PACKAGE_QUIET",(allocator *)&includeFlags);
  bVar2 = cmMakefile::IsOn(this_00,&includes);
  std::__cxx11::string::~string((string *)&includes);
  if (bVar1) {
    bVar3 = std::operator==(&mode,"EXIST");
    if (!bVar3) {
      bVar2 = std::operator==(&mode,"COMPILE");
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS",(allocator *)&definitions);
        pcVar4 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
        std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&linkPath);
        std::__cxx11::string::~string((string *)&includeFlags);
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        includeDirs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmSystemTools::ExpandListArgument(&includes,&includeDirs,false);
        std::__cxx11::string::string((string *)&definitions,"",(allocator *)&linkPath);
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,lg,&includeDirs,(cmGeneratorTarget *)0x0,&language,false,false,
                   &definitions);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::string
                  ((string *)&linkPath,"PACKAGE_DEFINITIONS",(allocator *)&linkFlags);
        pcVar4 = cmMakefile::GetSafeDefinition(this_00,&linkPath);
        std::__cxx11::string::string((string *)&definitions,pcVar4,(allocator *)&local_68);
        std::__cxx11::string::~string((string *)&linkPath);
        printf("%s %s\n",includeFlags._M_dataplus._M_p,definitions._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::~string((string *)&includeFlags);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includeDirs);
        std::__cxx11::string::~string((string *)&includes);
      }
      else {
        bVar2 = std::operator==(&mode,"LINK");
        if (bVar2) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          this_02 = cmMakefile::AddExecutable(this_00,"dummy",&srcs,true);
          std::__cxx11::string::string
                    ((string *)&includes,"LINKER_LANGUAGE",(allocator *)&includeFlags);
          cmTarget::SetProperty(this_02,&includes,language._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string
                    ((string *)&includeFlags,"PACKAGE_LIBRARIES",(allocator *)&definitions);
          pcVar4 = cmMakefile::GetSafeDefinition(this_00,&includeFlags);
          std::__cxx11::string::string((string *)&includes,pcVar4,(allocator *)&linkPath);
          std::__cxx11::string::~string((string *)&includeFlags);
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          libList.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          cmSystemTools::ExpandListArgument(&includes,&libList,false);
          for (lib = libList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
              lib != libList.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish; lib = lib + 1) {
            std::__cxx11::string::string((string *)&includeFlags,"dummy",(allocator *)&definitions);
            cmMakefile::AddLinkLibraryForTarget(this_00,&includeFlags,lib,GENERAL);
            std::__cxx11::string::~string((string *)&includeFlags);
          }
          includeFlags._M_dataplus._M_p = (pointer)&includeFlags.field_2;
          includeFlags._M_string_length = 0;
          definitions._M_dataplus._M_p = (pointer)&definitions.field_2;
          definitions._M_string_length = 0;
          includeFlags.field_2._M_local_buf[0] = '\0';
          definitions.field_2._M_local_buf[0] = '\0';
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          linkPath._M_string_length = 0;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeDirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          linkPath.field_2._M_local_buf[0] = '\0';
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)includeDirs.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          linkFlags._M_string_length = 0;
          linkFlags.field_2._M_local_buf[0] = '\0';
          cmGlobalGenerator::CreateGeneratorTargets(this_01,lg);
          target = cmGlobalGenerator::GetGeneratorTarget(this_01,this_02);
          cmLocalGenerator::GetTargetFlags
                    (lg,&includeFlags,&definitions,&linkPath,(string *)&includeDirs,&linkFlags,
                     target,false);
          std::operator+(&local_88,&definitions,&linkPath);
          std::operator+(&local_68,&local_88,&includeFlags);
          std::__cxx11::string::operator=((string *)&includeFlags,(string *)&local_68);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::~string((string *)&local_88);
          puts(includeFlags._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&linkFlags);
          std::__cxx11::string::~string((string *)&includeDirs);
          std::__cxx11::string::~string((string *)&linkPath);
          std::__cxx11::string::~string((string *)&definitions);
          std::__cxx11::string::~string((string *)&includeFlags);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          std::__cxx11::string::~string((string *)&includes);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_0032d373;
    }
    if (bVar2) goto LAB_0032d373;
    pcVar4 = "%s found.\n";
  }
  else {
    if (bVar2) goto LAB_0032d373;
    pcVar4 = "%s not found.\n";
  }
  printf(pcVar4,packageName._M_dataplus._M_p);
LAB_0032d373:
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string((string *)&language);
  std::__cxx11::string::~string((string *)&systemFile);
  if (lg != (cmLocalGenerator *)0x0) {
    (*lg->_vptr_cmLocalGenerator[1])();
  }
  return bVar1;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  // read in the list file to fill the cache
  cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  mf->SetCurrentBinaryDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  mf->SetCurrentSourceDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile.c_str());

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound)
    {
    if (!quiet)
      {
      printf("%s not found.\n", packageName.c_str());
      }
    }
  else if (mode == "EXIST")
    {
    if (!quiet)
      {
      printf("%s found.\n", packageName.c_str());
      }
    }
  else if (mode == "COMPILE")
    {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    std::string includeFlags = lg->GetIncludeFlags(includeDirs, 0, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
    }
  else if (mode == "LINK")
    {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for(std::vector<std::string>::const_iterator libIt=libList.begin();
            libIt != libList.end();
            ++libIt)
      {
      mf->AddLinkLibraryForTarget(targetName, *libIt,
                                  cmTarget::GENERAL);
      }


    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGeneratorTargets(lg.get());
    cmGeneratorTarget *gtgt = gg->GetGeneratorTarget(tgt);
    lg->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       gtgt, false);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str() );

/*    if ( use_win32 )
      {
      tgt->SetProperty("WIN32_EXECUTABLE", "ON");
      }
    if ( use_macbundle)
      {
      tgt->SetProperty("MACOSX_BUNDLE", "ON");
      }*/
    }

  // free generic one if generated
//  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
//  delete gg; // this crashes inside the cmake instance

  return packageFound;
}